

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QMetaMethodBuilderPrivate * __thiscall QMetaMethodBuilder::d_func(QMetaMethodBuilder *this)

{
  QMetaObjectBuilder *pQVar1;
  QMetaObjectBuilderPrivate *pQVar2;
  reference pvVar3;
  uint uVar4;
  vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *this_00;
  
  pQVar1 = this->_mobj;
  if (pQVar1 == (QMetaObjectBuilder *)0x0) {
    return (QMetaMethodBuilderPrivate *)0x0;
  }
  uVar4 = this->_index;
  if ((int)uVar4 < 0) {
    pQVar2 = pQVar1->d;
    if ((int)(((long)(pQVar2->constructors).
                     super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pQVar2->constructors).
                    super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x68) < (int)-uVar4) {
      return (QMetaMethodBuilderPrivate *)0x0;
    }
    this_00 = &pQVar2->constructors;
    uVar4 = ~uVar4;
  }
  else {
    pQVar2 = pQVar1->d;
    if ((int)(((long)(pQVar2->methods).
                     super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pQVar2->methods).
                    super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x68) <= (int)uVar4) {
      return (QMetaMethodBuilderPrivate *)0x0;
    }
    this_00 = &pQVar2->methods;
  }
  pvVar3 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
           operator[](this_00,(ulong)uVar4);
  return pvVar3;
}

Assistant:

QMetaMethodBuilderPrivate *QMetaMethodBuilder::d_func() const
{
    // Positive indices indicate methods, negative indices indicate constructors.
    if (_mobj && _index >= 0 && _index < int(_mobj->d->methods.size()))
        return &(_mobj->d->methods[_index]);
    else if (_mobj && -_index >= 1 && -_index <= int(_mobj->d->constructors.size()))
        return &(_mobj->d->constructors[(-_index) - 1]);
    else
        return nullptr;
}